

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_read.c
# Opt level: O3

int getl(char **lineptr,FILE *fp)

{
  ulong uVar1;
  int __c;
  int *piVar2;
  char *pcVar3;
  ulong uVar4;
  size_t __size;
  
  piVar2 = __errno_location();
  if (lineptr == (char **)0x0 || fp == (FILE *)0x0) {
    *piVar2 = 0x16;
  }
  else {
    if (*piVar2 != 0) {
      *piVar2 = 0;
    }
    if (*lineptr == (char *)0x0) {
      pcVar3 = (char *)malloc(0x50);
      *lineptr = pcVar3;
      if (pcVar3 == (char *)0x0) {
        return -1;
      }
    }
    __c = getc((FILE *)fp);
    if (__c != -1) {
      __size = 0x50;
      uVar1 = 2;
      do {
        uVar4 = uVar1;
        if (*piVar2 != 0) {
          return -1;
        }
        if (__size < uVar4) {
          if ((long)__size < 1) {
            *piVar2 = 0xc;
LAB_00103760:
            ungetc(__c,(FILE *)fp);
            return -1;
          }
          __size = __size * 2;
          pcVar3 = (char *)realloc(*lineptr,__size);
          if (pcVar3 == (char *)0x0) goto LAB_00103760;
          *lineptr = pcVar3;
        }
        else {
          pcVar3 = *lineptr;
        }
        pcVar3[uVar4 - 2] = (char)__c;
        if (__c == 10) break;
        if (uVar4 == 0x7fffffffffffffff) {
          *piVar2 = 0xc;
          return -1;
        }
        __c = getc((FILE *)fp);
        uVar1 = uVar4 + 1;
      } while (__c != -1);
      (*lineptr)[uVar4 - 1] = '\0';
      return (int)uVar4 + -1;
    }
    **lineptr = '\0';
  }
  return -1;
}

Assistant:

int getl(char **lineptr, FILE *fp) {
		int ch;
		ssize_t buf_pos = 0;
		ssize_t count = 2; /* Always buf_pos + 2 (see below). */
		size_t new_length = 0;
		size_t n = BUFSIZE;
		char *temp;

		if ((lineptr == NULL) || (fp == NULL)) {
			errno = EINVAL;
			return -1;
		}

		if (errno != 0)
			errno = 0;

		if (*lineptr == NULL) {
			*lineptr = malloc(n * sizeof(char));

			if (*lineptr == NULL) {
				return -1; /* Out of memory. */
			}
		}

		/*
		 * There are buf_pos characters in the buffer.  When we read another
		 * character, we want to store it, and we also need enough
		 * room for a nul string. So we need to realloc as soon as our capacity
		 * becomes less than buf_pos + 2.
		 * Hence the variable "count" which always equals buf_pos + 2.
		 */

		while ((ch = getc(fp)) != EOF) {
			if (errno != 0)
				return -1;

			if (count > n) { /* current chars read is going to blow our buffer - add more */
				new_length = n * 2; /* double the current buffer size */
				if (new_length <= n) { /* Overflow. */
					errno = ENOMEM;
					/* We couldn't store the character, */
					/* so put it back on the stream. */
					ungetc(ch, fp);
					return -1;
				}
				temp = (char *)realloc(*lineptr, new_length * sizeof(char)); /* realloc to a temp */
				if (temp == NULL) {
					ungetc(ch, fp);
					return -1;
				}
				n = new_length; /* set n to the new length we were able to get from system */
				*lineptr = temp; /* set line to this new temp string */
			}

			(*lineptr)[buf_pos++] = (char)ch; /* set this char in the string at buf_pos and THEN increment buf_pos */

			if (ch == '\n') /* eol */
				break;

			if (count == SSIZE_MAX) { /* SSIZE_MAX is 32767 - posix def */
				/* We'll overflow ssize_t on the next round, since the return
				 * type is SSIZE_T */
				errno = ENOMEM;
				return -1;
			}
			count++; /* increment ch count */
		}

		(*lineptr)[buf_pos] = '\0'; /* set last position to \0 */

		if (buf_pos == 0) { /* nothing in the file? */
			buf_pos = -1;
		}
		return buf_pos;
	}